

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,uint *args,uint *args_1,unsigned_long *args_2)

{
  Printer *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  uint x;
  unsigned_long x_00;
  string *local_f8;
  string_view local_d8 [2];
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  iterator local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_40;
  unsigned_long *local_30;
  unsigned_long *args_local_2;
  uint *args_local_1;
  uint *args_local;
  char *format_local;
  Formatter *this_local;
  
  this_00 = this->printer_;
  local_b8 = &local_b0;
  local_30 = args_2;
  args_local_2 = (unsigned_long *)args_1;
  args_local_1 = args;
  args_local = (uint *)format;
  format_local = (char *)this;
  ToString<unsigned_int,void>(local_b8,(Formatter *)(ulong)*args,(uint)args);
  local_b8 = &local_90;
  ToString<unsigned_int,void>(local_b8,(Formatter *)(ulong)(uint)*args_local_2,x);
  local_b8 = &local_70;
  ToString<unsigned_long,void>(local_b8,(Formatter *)*local_30,x_00);
  local_50 = &local_b0;
  local_48 = 3;
  v._M_len = 3;
  v._M_array = local_50;
  absl::lts_20240722::Span<std::__cxx11::string_const>::
  Span<std::__cxx11::string_const,std::__cxx11::string_const>
            ((Span<std::__cxx11::string_const> *)local_40._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_d8,(char *)args_local);
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (this_00,(Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_40,&this->vars_,local_d8[0]);
  local_f8 = (string *)&local_50;
  do {
    local_f8 = local_f8 + -1;
    std::__cxx11::string::~string((string *)local_f8);
  } while (local_f8 != &local_b0);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }